

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNMachine<char>::import_atn_node
          (CATNMachine<char> *this,ATNMachine<char> *atn,int index,int origin,
          vector<int,_std::allocator<int>_> *node_map,int tag)

{
  int index_00;
  pointer pAVar1;
  pointer pAVar2;
  pointer piVar3;
  ATNTransition<char> *tr;
  pointer pAVar4;
  CharClass<char> local_80;
  ATNMachine<char> *local_60;
  wchar_t local_58 [6];
  initializer_list<wchar_t> local_40;
  
  pAVar1 = (atn->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (node_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [index] = (int)(((long)(this->m_nodes).
                         super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_nodes).
                        super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  local_60 = atn;
  switch(pAVar1[index].m_type) {
  case Blank:
    local_80._vptr_CharClass = (_func_int **)&PTR__CharClass_00199040;
    local_80.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    origin = add_node(this,&local_80,origin,tag);
    goto LAB_0012ff7d;
  case Nonterminal:
    origin = import_nonterminal(this,&pAVar1[index].m_invoke,origin,tag);
    break;
  case LiteralTerminal:
    origin = import_literal_terminal(this,&pAVar1[index].m_literal,origin,tag);
    break;
  case RegularTerminal:
    origin = import_regular_terminal(this,&pAVar1[index].m_nfa,origin,tag);
    break;
  case WhiteSpace:
    local_40._M_array = local_58;
    local_40._M_len = 4;
    builtin_wcsncpy(local_58,L" \t\r\n",4);
    CharClass<char>::CharClass(&local_80,&local_40);
    origin = import_whitespace(this,&local_80,origin,tag);
LAB_0012ff7d:
    CharClass<char>::~CharClass(&local_80);
  }
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>._M_impl
  .super__Vector_impl_data._M_start[origin].m_source = index;
  pAVar2 = *(pointer *)
            ((long)&pAVar1[index].m_transitions.
                    super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                    ._M_impl + 8);
  for (pAVar4 = pAVar1[index].m_transitions.
                super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar4 != pAVar2; pAVar4 = pAVar4 + 1) {
    index_00 = pAVar4->m_dest;
    piVar3 = (node_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar3[index_00] < 0) {
      import_atn_node(this,local_60,index_00,origin,node_map,pAVar4->m_tag);
    }
    else {
      local_80._vptr_CharClass = (_func_int **)&PTR__CharClass_00199040;
      local_80.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CATNNode<char>::add_transition
                ((this->m_nodes).
                 super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + origin,&local_80,piVar3[index_00],
                 pAVar4->m_tag);
      CharClass<char>::~CharClass(&local_80);
    }
  }
  return;
}

Assistant:

void import_atn_node(const ATNMachine<TCHAR>& atn, int index, int origin, std::vector<int>& node_map, int tag)
    {
        const ATNNode<TCHAR>& node = atn.get_node(index);

        node_map[index] = m_nodes.size();

        switch (node.type())
        {
        case ATNNodeType::Blank:
            origin = add_node(CharClass<TCHAR>(), origin, tag);
            break;
        case ATNNodeType::LiteralTerminal:
            origin = import_literal_terminal(node.get_literal(), origin, tag);
            break;
        case ATNNodeType::RegularTerminal:
            origin = import_regular_terminal(node.get_nfa(), origin, tag);
            break;
        case ATNNodeType::Nonterminal:
            origin = import_nonterminal(node.get_submachine(), origin, tag);
            break;
        case ATNNodeType::WhiteSpace:
            origin = import_whitespace(CharClass<TCHAR>({u' ', u'\t', u'\r', u'\n'}), origin, tag);
            break;
        }

        m_nodes[origin].set_source(index);

        for (const auto& tr : node.get_transitions())
        {
            if (node_map[tr.dest()] < 0)
                import_atn_node(atn, tr.dest(), origin, node_map, tr.tag());
            else
                m_nodes[origin].add_transition(CharClass<TCHAR>(), node_map[tr.dest()], tr.tag());
        }
    }